

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O1

Option * __thiscall MetaCommand::GetOptionByMinusTag(MetaCommand *this,string *minusTag)

{
  int iVar1;
  Option *pOVar2;
  Option *unaff_R15;
  bool bVar3;
  string tagToSearch;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  pOVar2 = (this->m_OptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pOVar2 == (this->m_OptionVector).
                  super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      return (Option *)0x0;
    }
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-","");
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)(pOVar2->tag)._M_dataplus._M_p);
    if (local_48 == minusTag->_M_string_length) {
      if (local_48 == 0) {
        bVar3 = true;
      }
      else {
        iVar1 = bcmp(local_50,(minusTag->_M_dataplus)._M_p,local_48);
        bVar3 = iVar1 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (bVar3) {
      unaff_R15 = pOVar2;
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    pOVar2 = pOVar2 + 1;
  } while (!bVar3);
  return unaff_R15;
}

Assistant:

MetaCommand::Option *
MetaCommand::GetOptionByMinusTag(METAIO_STL::string minusTag)
{
  auto it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    METAIO_STL::string tagToSearch = "-";
    tagToSearch += (*it).tag;
    if(tagToSearch == minusTag)
      {
      return &(*it);
      }
    ++it;
    }
    return nullptr;
}